

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Node.hpp
# Opt level: O2

void __thiscall
CX3DImporter_NodeElement_Material::CX3DImporter_NodeElement_Material
          (CX3DImporter_NodeElement_Material *this,CX3DImporter_NodeElement *pParent)

{
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar1;
  
  (this->super_CX3DImporter_NodeElement).Type = ENET_Material;
  (this->super_CX3DImporter_NodeElement).ID._M_dataplus._M_p =
       (pointer)&(this->super_CX3DImporter_NodeElement).ID.field_2;
  (this->super_CX3DImporter_NodeElement).ID._M_string_length = 0;
  (this->super_CX3DImporter_NodeElement).ID.field_2._M_local_buf[0] = '\0';
  (this->super_CX3DImporter_NodeElement).Parent = pParent;
  plVar1 = &(this->super_CX3DImporter_NodeElement).Child;
  (this->super_CX3DImporter_NodeElement).Child.
  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->super_CX3DImporter_NodeElement).Child.
  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->super_CX3DImporter_NodeElement).Child.
  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  (this->super_CX3DImporter_NodeElement)._vptr_CX3DImporter_NodeElement =
       (_func_int **)&PTR__CX3DImporter_NodeElement_008228f0;
  this->AmbientIntensity = 0.0;
  (this->DiffuseColor).r = 0.0;
  (this->DiffuseColor).g = 0.0;
  (this->DiffuseColor).b = 0.0;
  (this->EmissiveColor).r = 0.0;
  (this->EmissiveColor).g = 0.0;
  *(undefined8 *)&(this->EmissiveColor).b = 0;
  this->Shininess = 0.0;
  (this->SpecularColor).r = 0.0;
  (this->SpecularColor).g = 0.0;
  (this->SpecularColor).b = 0.0;
  this->Transparency = 1.0;
  return;
}

Assistant:

CX3DImporter_NodeElement(const EType pType, CX3DImporter_NodeElement* pParent)
		: Type(pType), Parent(pParent)
	{}